

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O1

void BZ2_bzReadGetUnused(int *bzerror,BZFILE *b,void **unused,int *nUnused)

{
  if (b == (BZFILE *)0x0) {
    if (bzerror != (int *)0x0) {
      *bzerror = -2;
      return;
    }
  }
  else {
    if (*(int *)((long)b + 0x13e8) != 4) {
      if (bzerror != (int *)0x0) {
        *bzerror = -1;
      }
      *(undefined4 *)((long)b + 0x13e8) = 0xffffffff;
      return;
    }
    if (unused == (void **)0x0 || nUnused == (int *)0x0) {
      if (bzerror != (int *)0x0) {
        *bzerror = -2;
      }
      *(undefined4 *)((long)b + 0x13e8) = 0xfffffffe;
      return;
    }
    if (bzerror != (int *)0x0) {
      *bzerror = 0;
    }
    *(undefined4 *)((long)b + 0x13e8) = 0;
    *nUnused = *(int *)((long)b + 0x13a0);
    *unused = *(void **)((long)b + 0x1398);
  }
  return;
}

Assistant:

void BZ2_bzReadGetUnused 
                     ( int*    bzerror, 
                       BZFILE* b, 
                       void**  unused, 
                       int*    nUnused )
{
   bzFile* bzf = (bzFile*)b;
   if (bzf == NULL)
      { BZ_SETERR(BZ_PARAM_ERROR); return; };
   if (bzf->lastErr != BZ_STREAM_END)
      { BZ_SETERR(BZ_SEQUENCE_ERROR); return; };
   if (unused == NULL || nUnused == NULL)
      { BZ_SETERR(BZ_PARAM_ERROR); return; };

   BZ_SETERR(BZ_OK);
   *nUnused = bzf->strm.avail_in;
   *unused = bzf->strm.next_in;
}